

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void QtPromisePrivate::PromiseDispatch<void>::
     call<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>,tst_qpromise_finally::fulfilledThrows_void()::__0>
               (QPromiseResolve<void> *resolve,QPromiseReject<void> *reject,
               anon_class_8_1_a8c68091 fn)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  QByteArrayView QVar3;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x18);
  QVar3.m_data = (storage_type *)0x3;
  QVar3.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar3);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  *puVar2 = local_30;
  local_30 = 0;
  uVar1 = puVar2[1];
  puVar2[1] = local_28;
  puVar2[2] = local_20;
  local_28 = uVar1;
  __cxa_throw(puVar2,&QString::typeinfo,QString::~QString);
}

Assistant:

static void call(const Resolve& resolve, const Reject& reject, Functor fn, Args&&... args)
    {
        try {
            fn(std::forward<Args>(args)...);
            resolve();
        } catch (...) {
            reject(std::current_exception());
        }
    }